

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  long lVar1;
  long lVar2;
  Value VVar3;
  Value VVar4;
  
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  lVar1 = (*f)(VVar4.i64_,VVar3.i64_);
  lVar2 = (*f)(VVar4._8_8_,VVar3.i64_);
  VVar3._8_8_ = lVar2;
  VVar3.i64_ = lVar1;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}